

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

bool __thiscall
LinearScan::ClearLoopExitIfRegUnused
          (LinearScan *this,Lifetime *lifetime,RegNum reg,BranchInstr *branchInstr,Loop *loop)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  bool bVar5;
  uint sourceContextId;
  uint functionId;
  uint32 uVar6;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  undefined4 *puVar7;
  Type *pppLVar8;
  undefined7 in_register_00000011;
  ulong uVar9;
  undefined1 local_48 [8];
  Iterator __iter;
  
  __iter.current._4_4_ = (undefined4)CONCAT71(in_register_00000011,reg);
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bbe90,ClearRegLoopExitPhase,sourceContextId,functionId);
  if (((bVar3) &&
      (BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                         ((loop->regAlloc).symRegUseBv,(lifetime->sym->super_Sym).m_id),
      BVar4 == '\0')) && ((lifetime->field_0x9d & 8) == 0)) {
    uVar1 = lifetime->end;
    uVar6 = IR::Instr::GetNumber(&branchInstr->super_Instr);
    bVar3 = true;
    if (uVar6 < uVar1) {
      local_48 = (undefined1  [8])(loop->regAlloc).exitRegContentList;
      __iter.list = (SListBase<Lifetime_**,_Memory::ArenaAllocator,_RealCount> *)local_48;
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar9 = (ulong)__iter.current._4_1_;
      while( true ) {
        if (__iter.list == (SListBase<Lifetime_**,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar5) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar7 = 0;
        }
        __iter.list = (SListBase<Lifetime_**,_Memory::ArenaAllocator,_RealCount> *)
                      ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if ((undefined1  [8])__iter.list == local_48) break;
        pppLVar8 = SListBase<Lifetime_**,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                             ((Iterator *)local_48);
        if ((*pppLVar8)[uVar9] == lifetime) {
          (*pppLVar8)[uVar9] = (Lifetime *)0x0;
        }
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool LinearScan::ClearLoopExitIfRegUnused(Lifetime *lifetime, RegNum reg, IR::BranchInstr *branchInstr, Loop *loop)
{
    // If a lifetime was enregistered into the loop and then spilled, we need compensation at the bottom
    // of the loop to reload the lifetime into that register.
    // If that lifetime was spilled before it was ever used, we don't need the compensation code.
    // We do however need to clear the regContent on any loop exit as the register will not
    // be available anymore on that path.
    // Note: If the lifetime was reloaded into the same register, we might clear the regContent unnecessarily...
    if (!PHASE_OFF(Js::ClearRegLoopExitPhase, this->func))
    {
        return false;
    }
    if (!loop->regAlloc.symRegUseBv->Test(lifetime->sym->m_id) && !lifetime->needsStoreCompensation)
    {
        if (lifetime->end > branchInstr->GetNumber())
        {
            FOREACH_SLIST_ENTRY(Lifetime **, regContent, loop->regAlloc.exitRegContentList)
            {
                if (regContent[reg] == lifetime)
                {
                    regContent[reg] = nullptr;
                }
            } NEXT_SLIST_ENTRY;
        }
        return true;
    }

    return false;
}